

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node_struct *
pugi::impl::anon_unknown_0::append_new_node
          (xml_node_struct *node,xml_allocator *alloc,xml_node_type type)

{
  xml_node_struct *child;
  
  child = allocate_node(alloc,type);
  if (child != (xml_node_struct *)0x0) {
    append_node(child,node);
  }
  return child;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_node_struct* append_new_node(xml_node_struct* node, xml_allocator& alloc, xml_node_type type = node_element)
	{
		if (!alloc.reserve()) return NULL;

		xml_node_struct* child = allocate_node(alloc, type);
		if (!child) return NULL;

		append_node(child, node);

		return child;
	}